

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::vector<Token,_std::allocator<Token>_>_> * __thiscall
Parser::extractMacroParameter
          (optional<std::vector<Token,_std::allocator<Token>_>_> *__return_storage_ptr__,
          Parser *this,Token *macroStart)

{
  TokenType TVar1;
  Tokenizer *this_00;
  Token *pTVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  vector<Token,_std::allocator<Token>_> tokens;
  vector<Token,_std::allocator<Token>_> local_58;
  TokenizerPosition local_38;
  
  local_38.it._M_node =
       (iterator)
       (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  while (pTVar2 = peekToken(this,0), pTVar2->type != Separator) {
    pTVar2 = peekToken(this,0);
    TVar1 = pTVar2->type;
    if ((((TVar1 == Comma) && (iVar5 == 0)) && (iVar4 == 0)) && (iVar3 == 0)) goto LAB_0014071a;
    switch(TVar1) {
    case LBrack:
      iVar3 = iVar3 + 1;
      break;
    case RBrack:
      iVar3 = iVar3 + -1;
      break;
    case Comma:
    case Assign:
    case Equ:
    case EquValue:
    case Hash:
      break;
    case LBrace:
      iVar4 = iVar4 + 1;
      break;
    case RBrace:
      iVar4 = iVar4 + -1;
      break;
    default:
      if (TVar1 == RParen) {
        iVar5 = iVar5 + -1;
      }
      else if (TVar1 == LParen) {
        iVar5 = iVar5 + 1;
      }
    }
    eatToken(this);
  }
  if (iVar5 == 0) {
LAB_0014071a:
    this_00 = (this->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].tokenizer;
    Tokenizer::getTokens
              (&local_58,this_00,local_38,(TokenizerPosition)(this_00->position).it._M_node);
    bVar6 = local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (bVar6) {
      printError<>(this,macroStart,"Empty macro argument");
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
        super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload.
        _M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
               _M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 8) =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>).
               _M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl + 0x10) =
           local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
    super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = !bVar6;
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_58);
  }
  else {
    printError<>(this,macroStart,"Unbalanced parentheses in macro parameter");
    (__return_storage_ptr__->
    super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>)._M_payload.
    super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Token>> Parser::extractMacroParameter(const Token &macroStart)
{
	TokenizerPosition startPos = getTokenizer()->getPosition();

	// Find the end of the parameter. The parameter may contain expressions with function calls,
	// so keep track of the current parenthesis depth level
	int parenCount = 0;
	int braceCount = 0;
	int bracketCount = 0;

	while (peekToken().type != TokenType::Separator)
	{
		// if the next token is a comma, only exit the loop if parentheses are balanced
		auto type = peekToken().type;
		if (type == TokenType::Comma && parenCount == 0 && braceCount == 0 && bracketCount == 0)
			break;

		// keep track of parenthesis depth
		switch (type)
		{
		case TokenType::LParen:
			++parenCount;
			break;
		case TokenType::RParen:
			--parenCount;
			break;
		case TokenType::LBrace:
			++braceCount;
			break;
		case TokenType::RBrace:
			--braceCount;
			break;
		case TokenType::LBrack:
			++bracketCount;
			break;
		case TokenType::RBrack:
			--bracketCount;
			break;
		default:
			break;
		}

		eatToken();
	}

	if (parenCount != 0)
	{
		printError(macroStart, "Unbalanced parentheses in macro parameter");
		return std::nullopt;
	}

	TokenizerPosition endPos = getTokenizer()->getPosition();
	std::vector<Token> tokens = getTokenizer()->getTokens(startPos,endPos);
	if (tokens.size() == 0)
	{
		printError(macroStart, "Empty macro argument");
		return std::nullopt;
	}

	return tokens;
}